

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genrsa.cc
# Opt level: O0

bool GenerateRSAKey(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args)

{
  bool bVar1;
  int iVar2;
  pointer prVar3;
  BIGNUM *pBVar4;
  BIO *pBVar5;
  unique_ptr<bio_st,_bssl::internal::Deleter> local_a0;
  UniquePtr<BIO> bio;
  UniquePtr<BIGNUM> e;
  UniquePtr<RSA> rsa;
  string local_80;
  uint local_5c [2];
  uint bits;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  args_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  bVar1 = ParseKeyValueArguments
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)args_map._M_t._M_impl.super__Rb_tree_header._M_node_count,kArguments);
  if (!bVar1) {
    PrintUsage(kArguments);
    args_local._7_1_ = false;
    local_5c[1] = 1;
    goto LAB_001300b4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"-bits",
             (allocator<char> *)
             ((long)&rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl + 7));
  bVar1 = GetUnsigned(local_5c,&local_80,0x800,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_48);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl + 7));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    PrintUsage(kArguments);
    args_local._7_1_ = false;
    local_5c[1] = 1;
    goto LAB_001300b4;
  }
  prVar3 = (pointer)RSA_new();
  std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&e,prVar3);
  pBVar4 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&bio,(pointer)pBVar4);
  pBVar5 = BIO_new_fp(_stdout,0);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&local_a0,(pointer)pBVar5);
  pBVar4 = (BIGNUM *)
           std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&bio);
  iVar2 = BN_set_word(pBVar4,0x10001);
  if (iVar2 == 0) {
LAB_00130015:
    ERR_print_errors_fp(_stderr);
    args_local._7_1_ = false;
  }
  else {
    prVar3 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&e);
    pBVar4 = (BIGNUM *)
             std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&bio);
    iVar2 = RSA_generate_key_ex((RSA *)prVar3,local_5c[0],pBVar4,(BN_GENCB *)0x0);
    if (iVar2 == 0) goto LAB_00130015;
    pBVar5 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_a0);
    prVar3 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&e);
    iVar2 = PEM_write_bio_RSAPrivateKey
                      (pBVar5,(RSA *)prVar3,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,
                       (void *)0x0);
    if (iVar2 == 0) goto LAB_00130015;
    args_local._7_1_ = true;
  }
  local_5c[1] = 1;
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_a0);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&bio);
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&e);
LAB_001300b4:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return args_local._7_1_;
}

Assistant:

bool GenerateRSAKey(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;

  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  unsigned bits;
  if (!GetUnsigned(&bits, "-bits", 2048, args_map)) {
    PrintUsage(kArguments);
    return false;
  }

  bssl::UniquePtr<RSA> rsa(RSA_new());
  bssl::UniquePtr<BIGNUM> e(BN_new());
  bssl::UniquePtr<BIO> bio(BIO_new_fp(stdout, BIO_NOCLOSE));

  if (!BN_set_word(e.get(), RSA_F4) ||
      !RSA_generate_key_ex(rsa.get(), bits, e.get(), NULL) ||
      !PEM_write_bio_RSAPrivateKey(bio.get(), rsa.get(), NULL /* cipher */,
                                   NULL /* key */, 0 /* key len */,
                                   NULL /* password callback */,
                                   NULL /* callback arg */)) {
    ERR_print_errors_fp(stderr);
    return false;
  }

  return true;
}